

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlDependence.h
# Opt level: O3

LLVMControlDependenceAnalysis * __thiscall
dg::LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>
          (LLVMControlDependenceAnalysis *this,BasicBlock *v)

{
  ValVec interproc;
  void *local_30;
  undefined8 local_28;
  long local_20;
  
  (**(code **)(**(long **)(v + 0x68) + 0x38))();
  if (v[100] == (BasicBlock)0x1) {
    (**(code **)(**(long **)(v + 0x70) + 0x38))(&local_30);
    std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<llvm::Value**,std::vector<llvm::Value*,std::allocator<llvm::Value*>>>>
              ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)this,
               (this->_options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,local_30,
               local_28);
    if (local_30 != (void *)0x0) {
      operator_delete(local_30,local_20 - (long)local_30);
    }
  }
  return this;
}

Assistant:

ValVec _getDependencies(ValT v) {
        assert(_impl);
        auto ret = _impl->getDependencies(v);

        if (getOptions().interproceduralCD()) {
            assert(_interprocImpl);
            auto interproc = _interprocImpl->getDependencies(v);
            ret.insert(ret.end(), interproc.begin(), interproc.end());
        }
        return ret;
    }